

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExperimentResult.cpp
# Opt level: O0

double __thiscall celero::ExperimentResult::getBaselineMeasurement(ExperimentResult *this)

{
  bool bVar1;
  Impl *pIVar2;
  element_type *x;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double baselineResultUs;
  shared_ptr<celero::ExperimentResult> baselineResult;
  undefined1 local_38 [8];
  shared_ptr<celero::Experiment> baselineExperiment;
  shared_ptr<celero::Benchmark> bm;
  ExperimentResult *this_local;
  
  pIVar2 = Pimpl<celero::ExperimentResult::Impl>::operator->(&this->pimpl);
  bVar1 = Experiment::getIsBaselineCase(pIVar2->parent);
  if (bVar1) {
    return 1.0;
  }
  Pimpl<celero::ExperimentResult::Impl>::operator->(&this->pimpl);
  Experiment::getBenchmark
            ((Experiment *)
             &baselineExperiment.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = std::operator!=((shared_ptr<celero::Benchmark> *)
                          &baselineExperiment.
                           super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &baselineExperiment.
                super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Benchmark::getBaseline((Benchmark *)local_38);
    bVar1 = std::operator!=((shared_ptr<celero::Experiment> *)local_38,(nullptr_t)0x0);
    if (bVar1) {
      x = std::__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<celero::Experiment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
      getProblemSpaceValue(this);
      Experiment::getResultByValue((Experiment *)&baselineResultUs,(int64_t)x);
      bVar1 = std::operator!=((shared_ptr<celero::ExperimentResult> *)&baselineResultUs,
                              (nullptr_t)0x0);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&baselineResultUs);
        dVar4 = getUsPerCall(peVar3);
        if (dVar4 <= 0.0) goto LAB_001b6683;
        dVar4 = getUsPerCall(this);
        peVar3 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&baselineResultUs);
        dVar5 = getUsPerCall(peVar3);
        this_local = (ExperimentResult *)(dVar4 / dVar5);
        bVar1 = true;
      }
      else {
LAB_001b6683:
        bVar1 = false;
      }
      std::shared_ptr<celero::ExperimentResult>::~shared_ptr
                ((shared_ptr<celero::ExperimentResult> *)&baselineResultUs);
      if (!bVar1) goto LAB_001b669e;
    }
    else {
LAB_001b669e:
      bVar1 = false;
    }
    std::shared_ptr<celero::Experiment>::~shared_ptr((shared_ptr<celero::Experiment> *)local_38);
    if (bVar1) goto LAB_001b66d8;
  }
  this_local = (ExperimentResult *)0xbff0000000000000;
LAB_001b66d8:
  std::shared_ptr<celero::Benchmark>::~shared_ptr
            ((shared_ptr<celero::Benchmark> *)
             &baselineExperiment.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (double)this_local;
}

Assistant:

double ExperimentResult::getBaselineMeasurement() const
{
	if(this->pimpl->parent->getIsBaselineCase() == false)
	{
		const auto bm = this->pimpl->parent->getBenchmark();

		if(bm != nullptr)
		{
			const auto baselineExperiment = bm->getBaseline();

			if(baselineExperiment != nullptr)
			{
				const auto baselineResult = baselineExperiment->getResultByValue(this->getProblemSpaceValue());

				if(baselineResult != nullptr)
				{
					const auto baselineResultUs = baselineResult->getUsPerCall();

					// Prevent possible divide by zero.
					if(baselineResultUs > 0)
					{
						return this->getUsPerCall() / baselineResult->getUsPerCall();
					}
				}
			}
		}

		return -1.0;
	}

	return 1.0;
}